

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O3

Gia_Man_t *
Gia_SweeperExtractUserLogic
          (Gia_Man_t *p,Vec_Int_t *vProbeIds,Vec_Ptr_t *vInNames,Vec_Ptr_t *vOutNames)

{
  char *pcVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *pVVar4;
  uint uVar5;
  int iVar6;
  Vec_Int_t *vObjIds;
  int *piVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Gia_Obj_t *pGVar10;
  Vec_Int_t *pVVar11;
  Gia_Man_t *pGVar12;
  Vec_Ptr_t *pVVar13;
  void **ppvVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  
  if ((vInNames != (Vec_Ptr_t *)0x0) && (p->vCis->nSize - p->nRegs != vInNames->nSize)) {
    __assert_fail("vInNames == NULL || Gia_ManPiNum(p) == Vec_PtrSize(vInNames)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweeper.c"
                  ,0x16c,
                  "Gia_Man_t *Gia_SweeperExtractUserLogic(Gia_Man_t *, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  if ((vOutNames != (Vec_Ptr_t *)0x0) && (vProbeIds->nSize != vOutNames->nSize)) {
    __assert_fail("vOutNames == NULL || Vec_IntSize(vProbeIds) == Vec_PtrSize(vOutNames)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweeper.c"
                  ,0x16d,
                  "Gia_Man_t *Gia_SweeperExtractUserLogic(Gia_Man_t *, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  Gia_ManIncrementTravId(p);
  vObjIds = (Vec_Int_t *)malloc(0x10);
  vObjIds->nCap = 1000;
  vObjIds->nSize = 0;
  piVar7 = (int *)malloc(4000);
  vObjIds->pArray = piVar7;
  iVar6 = vProbeIds->nSize;
  if (iVar6 < 1) {
    iVar15 = 0;
  }
  else {
    lVar18 = 0;
    do {
      uVar5 = Gia_SweeperProbeLit(p,vProbeIds->pArray[lVar18]);
      if (p->nObjs <= (int)(uVar5 >> 1)) goto LAB_00733990;
      Gia_ManExtract_rec(p,(Gia_Obj_t *)((ulong)(p->pObjs + (uVar5 >> 1)) & 0xfffffffffffffffe),
                         vObjIds);
      lVar18 = lVar18 + 1;
      iVar6 = vProbeIds->nSize;
    } while (lVar18 < iVar6);
    iVar15 = vObjIds->nSize;
  }
  p_00 = Gia_ManStart(iVar15 + (iVar6 - p->nRegs) + p->vCis->nSize + 0x65);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar1);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar1);
  }
  p_00->pName = pcVar9;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar1);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar1);
  }
  p_00->pSpec = pcVar9;
  p->pObjs->Value = 0;
  pVVar11 = p->vCis;
  uVar16 = (ulong)(uint)pVVar11->nSize;
  if (p->nRegs < pVVar11->nSize) {
    lVar18 = 0;
    do {
      if ((int)uVar16 <= lVar18) goto LAB_007339ce;
      iVar6 = pVVar11->pArray[lVar18];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_00733990;
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar10 = Gia_ManAppendObj(p_00);
      uVar16 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar16 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar16 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar3 = p_00->pObjs;
      if ((pGVar10 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar10)) {
LAB_007339af:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar3) >> 2) * -0x55555555);
      pGVar3 = p_00->pObjs;
      if ((pGVar10 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar10)) goto LAB_007339af;
      pGVar2[iVar6].Value = (int)((ulong)((long)pGVar10 - (long)pGVar3) >> 2) * 0x55555556;
      lVar18 = lVar18 + 1;
      pVVar11 = p->vCis;
      uVar16 = (ulong)pVVar11->nSize;
    } while (lVar18 < (long)(uVar16 - (long)p->nRegs));
  }
  Gia_ManHashStart(p_00);
  iVar6 = vObjIds->nSize;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  iVar15 = 0x10;
  if (0xe < iVar6 - 1U) {
    iVar15 = iVar6;
  }
  pVVar11->nSize = 0;
  pVVar11->nCap = iVar15;
  if (iVar15 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)iVar15 << 2);
  }
  pVVar11->pArray = piVar7;
  if (0 < iVar6) {
    lVar18 = 0;
    do {
      iVar6 = vObjIds->pArray[lVar18];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_00733990;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = p->pObjs + iVar6;
      Vec_IntPush(pVVar11,pGVar2->Value);
      uVar16 = *(ulong *)pGVar2;
      if ((int)pGVar2[-(ulong)((uint)uVar16 & 0x1fffffff)].Value < 0) {
LAB_007339ed:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10f,"int Abc_LitNotCond(int, int)");
      }
      uVar5 = (uint)(uVar16 >> 0x20);
      if ((int)pGVar2[-(ulong)(uVar5 & 0x1fffffff)].Value < 0) goto LAB_007339ed;
      uVar5 = Gia_ManHashAnd(p_00,(uint)(uVar16 >> 0x1d) & 1 ^
                                  pGVar2[-(ulong)((uint)uVar16 & 0x1fffffff)].Value,
                             pGVar2[-(ulong)(uVar5 & 0x1fffffff)].Value ^ uVar5 >> 0x1d & 1);
      pGVar2->Value = uVar5;
      lVar18 = lVar18 + 1;
    } while (lVar18 < vObjIds->nSize);
  }
  Gia_ManHashStop(p_00);
  if (0 < vProbeIds->nSize) {
    lVar18 = 0;
    do {
      uVar5 = Gia_SweeperProbeLit(p,vProbeIds->pArray[lVar18]);
      if (p->nObjs <= (int)(uVar5 >> 1)) goto LAB_00733990;
      Gia_ManAppendCo(p_00,(uVar5 ^ (uint)(p->pObjs + (uVar5 >> 1))) & 1 ^
                           *(uint *)(((ulong)(p->pObjs + (uVar5 >> 1)) & 0xfffffffffffffffe) + 8));
      lVar18 = lVar18 + 1;
    } while (lVar18 < vProbeIds->nSize);
  }
  pVVar4 = p->vCis;
  uVar5 = pVVar4->nSize;
  uVar19 = uVar5 - p->nRegs;
  if (uVar19 != 0 && p->nRegs <= (int)uVar5) {
    uVar17 = 0;
    uVar16 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar16 = uVar17;
    }
    do {
      if (uVar16 == uVar17) goto LAB_007339ce;
      iVar6 = pVVar4->pArray[uVar17];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_00733990;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      p->pObjs[iVar6].Value = 0;
      uVar17 = uVar17 + 1;
    } while (uVar19 != uVar17);
  }
  iVar6 = vObjIds->nSize;
  piVar7 = vObjIds->pArray;
  if ((long)iVar6 < 1) {
    if (piVar7 == (int *)0x0) goto LAB_007337ff;
  }
  else {
    lVar18 = 0;
    do {
      iVar15 = piVar7[lVar18];
      if (((long)iVar15 < 0) || (p->nObjs <= iVar15)) {
LAB_00733990:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (pVVar11->nSize <= lVar18) {
LAB_007339ce:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      p->pObjs[iVar15].Value = pVVar11->pArray[lVar18];
      lVar18 = lVar18 + 1;
    } while (iVar6 != lVar18);
  }
  free(piVar7);
LAB_007337ff:
  free(vObjIds);
  if (pVVar11->pArray != (int *)0x0) {
    free(pVVar11->pArray);
  }
  free(pVVar11);
  iVar6 = Gia_ManHasDangling(p_00);
  pGVar12 = p_00;
  if (iVar6 != 0) {
    pGVar12 = Gia_ManCleanup(p_00);
    Gia_ManStop(p_00);
  }
  if (vInNames != (Vec_Ptr_t *)0x0) {
    pVVar13 = (Vec_Ptr_t *)malloc(0x10);
    iVar6 = vInNames->nSize;
    pVVar13->nSize = iVar6;
    iVar15 = vInNames->nCap;
    pVVar13->nCap = iVar15;
    if ((long)iVar15 == 0) {
      ppvVar14 = (void **)0x0;
    }
    else {
      ppvVar14 = (void **)malloc((long)iVar15 << 3);
    }
    pVVar13->pArray = ppvVar14;
    memcpy(ppvVar14,vInNames->pArray,(long)iVar6 * 8);
    if (0 < iVar6) {
      lVar18 = 0;
      do {
        pcVar1 = (char *)ppvVar14[lVar18];
        if (pcVar1 == (char *)0x0) {
          pcVar9 = (char *)0x0;
        }
        else {
          sVar8 = strlen(pcVar1);
          pcVar9 = (char *)malloc(sVar8 + 1);
          strcpy(pcVar9,pcVar1);
        }
        ppvVar14[lVar18] = pcVar9;
        lVar18 = lVar18 + 1;
      } while (iVar6 != lVar18);
    }
    pGVar12->vNamesIn = pVVar13;
  }
  if (vOutNames != (Vec_Ptr_t *)0x0) {
    pVVar13 = (Vec_Ptr_t *)malloc(0x10);
    iVar6 = vOutNames->nSize;
    pVVar13->nSize = iVar6;
    iVar15 = vOutNames->nCap;
    pVVar13->nCap = iVar15;
    if ((long)iVar15 == 0) {
      ppvVar14 = (void **)0x0;
    }
    else {
      ppvVar14 = (void **)malloc((long)iVar15 << 3);
    }
    pVVar13->pArray = ppvVar14;
    memcpy(ppvVar14,vOutNames->pArray,(long)iVar6 * 8);
    if (0 < iVar6) {
      lVar18 = 0;
      do {
        pcVar1 = (char *)ppvVar14[lVar18];
        if (pcVar1 == (char *)0x0) {
          pcVar9 = (char *)0x0;
        }
        else {
          sVar8 = strlen(pcVar1);
          pcVar9 = (char *)malloc(sVar8 + 1);
          strcpy(pcVar9,pcVar1);
        }
        ppvVar14[lVar18] = pcVar9;
        lVar18 = lVar18 + 1;
      } while (iVar6 != lVar18);
    }
    pGVar12->vNamesOut = pVVar13;
  }
  return pGVar12;
}

Assistant:

Gia_Man_t * Gia_SweeperExtractUserLogic( Gia_Man_t * p, Vec_Int_t * vProbeIds, Vec_Ptr_t * vInNames, Vec_Ptr_t * vOutNames )
{
    Vec_Int_t * vObjIds, * vValues;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, ProbeId;
    assert( vInNames  == NULL || Gia_ManPiNum(p) == Vec_PtrSize(vInNames) );
    assert( vOutNames == NULL || Vec_IntSize(vProbeIds) == Vec_PtrSize(vOutNames) );
    // create new
    Gia_ManIncrementTravId( p );
    vObjIds = Vec_IntAlloc( 1000 );
    Vec_IntForEachEntry( vProbeIds, ProbeId, i )
    {
        pObj = Gia_Lit2Obj( p, Gia_SweeperProbeLit(p, ProbeId) );
        Gia_ManExtract_rec( p, Gia_Regular(pObj), vObjIds );
    }
    // create new manager
    pNew = Gia_ManStart( 1 + Gia_ManPiNum(p) + Vec_IntSize(vObjIds) + Vec_IntSize(vProbeIds) + 100 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // create internal nodes
    Gia_ManHashStart( pNew );
    vValues = Vec_IntAlloc( Vec_IntSize(vObjIds) );
    Gia_ManForEachObjVec( vObjIds, p, pObj, i )
    {
        Vec_IntPush( vValues, pObj->Value );
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    }
    Gia_ManHashStop( pNew );
    // create outputs
    Vec_IntForEachEntry( vProbeIds, ProbeId, i )
    {
        pObj = Gia_Lit2Obj( p, Gia_SweeperProbeLit(p, ProbeId) );
        Gia_ManAppendCo( pNew, Gia_Regular(pObj)->Value ^ Gia_IsComplement(pObj) );
    }
    // return the values back
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = 0;
    Gia_ManForEachObjVec( vObjIds, p, pObj, i )
        pObj->Value = Vec_IntEntry( vValues, i );
    Vec_IntFree( vObjIds );
    Vec_IntFree( vValues );
    // duplicate if needed
    if ( Gia_ManHasDangling(pNew) )
    {
        pNew = Gia_ManCleanup( pTemp = pNew );
        Gia_ManStop( pTemp );
    }
    // copy names if present
    if ( vInNames )
        pNew->vNamesIn = Vec_PtrDupStr( vInNames );
    if ( vOutNames )
        pNew->vNamesOut = Vec_PtrDupStr( vOutNames );
    return pNew;
}